

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.h
# Opt level: O1

size_t __thiscall io_buf::bin_read_fixed(io_buf *this,char *data,size_t len,char *read_message)

{
  uint uVar1;
  int iVar2;
  size_t __n;
  size_t sVar3;
  vw_exception *this_00;
  byte *pbVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  char *p;
  stringstream __msg;
  char *local_1d8;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0;
  
  if (len == 0) {
    __n = 0;
  }
  else {
    __n = buf_read(this,&local_1d8,len);
    if (this->_verify_hash == true) {
      uVar8 = this->_hash;
      uVar1 = (uint)__n;
      uVar5 = uVar1;
      if ((int)uVar1 < 0) {
        uVar5 = uVar1 + 3;
      }
      pbVar4 = (byte *)(local_1d8 + (int)(uVar5 & 0xfffffffc));
      if (6 < uVar1 + 3) {
        lVar7 = (long)-((int)uVar5 >> 2);
        do {
          uVar8 = ((uint)(*(int *)(pbVar4 + lVar7 * 4) * -0x3361d2af) >> 0x11 |
                  *(int *)(pbVar4 + lVar7 * 4) * 0x16a88000) * 0x1b873593 ^ uVar8;
          uVar8 = (uVar8 << 0xd | uVar8 >> 0x13) * 5 + 0xe6546b64;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0);
      }
      uVar6 = 0;
      uVar5 = 0;
      switch(uVar1 & 3) {
      case 3:
        uVar5 = (uint)pbVar4[2] << 0x10;
      case 2:
        uVar6 = uVar5 | (uint)pbVar4[1] << 8;
      case 1:
        uVar8 = uVar8 ^ ((*pbVar4 ^ uVar6) * -0x3361d2af >> 0x11 | (*pbVar4 ^ uVar6) * 0x16a88000) *
                        0x1b873593;
      case 0:
        uVar8 = ((uVar8 ^ uVar1) >> 0x10 ^ uVar8 ^ uVar1) * -0x7a143595;
        uVar8 = (uVar8 >> 0xd ^ uVar8) * -0x3d4d51cb;
        this->_hash = uVar8 >> 0x10 ^ uVar8;
      }
    }
    if (*read_message == '\0') {
      memcpy(data,local_1d8,__n);
    }
    else {
      iVar2 = bcmp(data,local_1d8,__n);
      if (iVar2 != 0) {
        std::__cxx11::stringstream::stringstream(local_1b0);
        sVar3 = strlen(read_message);
        std::__ostream_insert<char,std::char_traits<char>>(&local_1a0,read_message,sVar3);
        this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (this_00,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/io_buf.h"
                   ,0xf9,&local_1d0);
        __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
    }
  }
  return __n;
}

Assistant:

size_t bin_read_fixed(char* data, size_t len, const char* read_message)
  {
    if (len > 0)
    {
      char* p;
      // if the model is corrupt the number of bytes can be less then specified (as there isn't enought data available
      // in the file)
      len = buf_read(p, len);

      // compute hash for check-sum
      if (_verify_hash)
        _hash = (uint32_t)uniform_hash(p, len, _hash);

      if (*read_message == '\0')
        memcpy(data, p, len);
      else if (memcmp(data, p, len) != 0)
        THROW(read_message);
      return len;
    }
    return 0;
  }